

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# F3DAudio.c
# Opt level: O0

void ComputeEmitterChannelCoefficients
               (ConfigInfo *curConfig,F3DAUDIO_BASIS *listenerBasis,float innerRadius,
               F3DAUDIO_VECTOR channelPosition,float attenuation,float LFEattenuation,uint32_t flags
               ,uint32_t currentChannel,uint32_t numSrcChannels,float *pMatrixCoefficients)

{
  code *pcVar1;
  undefined8 uVar2;
  int iVar3;
  int in_ECX;
  ulong uVar4;
  uint in_EDX;
  float *in_RSI;
  long in_RDI;
  uint in_R8D;
  long in_R9;
  float in_XMM0_Da;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float in_XMM1_Da;
  float in_XMM1_Db;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  F3DAUDIO_VECTOR FVar9;
  SDL_AssertState sdl_assert_state_3;
  SDL_AssertState sdl_assert_state_2;
  float totalEnergy_2;
  SDL_AssertState sdl_assert_state_1;
  float totalEnergy_1;
  uint32_t curSpeakerIdx;
  SDL_AssertState sdl_assert_state;
  uint32_t i1;
  uint32_t i0;
  float val;
  float a1;
  float a0;
  SpeakerInfo *infos [2];
  uint32_t centerChannelIdx;
  uint32_t iS;
  uint32_t nChannelsToDiffuseTo;
  float totalEnergy;
  float energyPerChannel;
  float emitterAzimuth;
  float y;
  float x;
  DiffusionSpeakerFactors diffusionFactors;
  uint8_t skipCenter;
  F3DAUDIO_VECTOR projPlane;
  F3DAUDIO_VECTOR projTopVec;
  float radialDistance;
  float elevation;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  uint8_t skipCenter_00;
  float fVar10;
  undefined4 in_stack_ffffffffffffff04;
  undefined8 local_e8;
  float local_e0;
  float local_bc;
  float *local_b8;
  float *local_b0;
  int local_a8;
  uint local_a4;
  uint local_a0;
  float local_94;
  float local_88 [4];
  byte local_75;
  undefined8 local_74;
  float local_6c;
  undefined8 local_68;
  float local_60;
  float local_58;
  float local_54;
  long local_50;
  uint local_48;
  int local_44;
  uint local_40;
  float local_3c;
  float local_38;
  float local_34;
  float *local_30;
  long local_28;
  float local_10;
  float fStack_c;
  float local_8;
  
  local_75 = (byte)(in_EDX >> 0x10) & 1;
  local_88[2] = 0.0;
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  local_a8 = -1;
  local_54 = in_RSI[8] * in_XMM2_Da + in_RSI[6] * in_XMM1_Da + in_RSI[7] * in_XMM1_Db;
  local_50 = in_R9;
  local_48 = in_R8D;
  local_44 = in_ECX;
  local_40 = in_EDX;
  local_3c = in_XMM4_Da;
  local_38 = in_XMM3_Da;
  local_34 = in_XMM0_Da;
  local_30 = in_RSI;
  local_28 = in_RDI;
  local_8 = in_XMM2_Da;
  local_10 = in_XMM1_Da;
  fStack_c = in_XMM1_Db;
  FVar9 = Vec(in_RSI[6] * local_54,in_RSI[7] * local_54,in_RSI[8] * local_54);
  local_e0 = FVar9.z;
  local_e8 = FVar9._0_8_;
  local_60 = local_e0;
  local_68 = local_e8;
  uVar2 = local_68;
  local_68._0_4_ = FVar9.x;
  local_68._4_4_ = FVar9.y;
  local_10 = local_10 - (float)local_68;
  fStack_c = fStack_c - local_68._4_4_;
  local_68 = uVar2;
  FVar9 = Vec(local_10,fStack_c,local_8 - local_e0);
  fVar7 = FVar9.x;
  fVar10 = FVar9.y;
  fVar8 = FVar9.z;
  local_74 = FVar9._0_8_;
  local_6c = fVar8;
  local_58 = (float)SDL_sqrtf(fVar8 * fVar8 + fVar7 * fVar7 + fVar10 * fVar10);
  ComputeInnerRadiusDiffusionFactors(local_58,local_34,local_88);
  if (0.0 < local_88[0]) {
    local_a0 = *(uint *)(local_28 + 0x10);
    fVar5 = local_88[0] * local_38;
    if (local_75 != 0) {
      local_a0 = local_a0 - 1;
      do {
        if (**(float **)(local_28 + 8) == 0.0) goto LAB_0010f05d;
        in_stack_fffffffffffffef4 =
             SDL_ReportAssertion(&ComputeEmitterChannelCoefficients::sdl_assert_data,
                                 "ComputeEmitterChannelCoefficients",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                 ,0x3f4);
      } while (in_stack_fffffffffffffef4 == 0);
      if (in_stack_fffffffffffffef4 == 1) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
LAB_0010f05d:
      local_a8 = *(int *)(*(long *)(local_28 + 8) + 4);
    }
    for (local_a4 = 0; local_a4 < *(uint *)(local_28 + 0x10); local_a4 = local_a4 + 1) {
      in_stack_fffffffffffffef0 = *(int *)(*(long *)(local_28 + 8) + 4 + (ulong)local_a4 * 8);
      if ((local_75 == 0) || (in_stack_fffffffffffffef0 != local_a8)) {
        uVar4 = (ulong)(in_stack_fffffffffffffef0 * local_48 + local_44);
        *(float *)(local_50 + uVar4 * 4) =
             fVar5 / (float)local_a0 + *(float *)(local_50 + uVar4 * 4);
      }
    }
  }
  skipCenter_00 = (uint8_t)((uint)fVar7 >> 0x18);
  if (0.0 < local_88[1]) {
    fVar5 = local_88[1] * local_38;
    local_94 = (float)SDL_atan2f(local_30[5] * local_6c +
                                 local_30[3] * (float)local_74 + local_30[4] * local_74._4_4_,
                                 local_30[2] * local_6c +
                                 *local_30 * (float)local_74 + local_30[1] * local_74._4_4_);
    if (local_94 < 0.0) {
      local_94 = local_94 + 6.2831855;
    }
    FindSpeakerAzimuths((ConfigInfo *)CONCAT44(in_stack_ffffffffffffff04,fVar8),fVar10,
                        (uint8_t)((uint)fVar7 >> 0x18),
                        (SpeakerInfo **)
                        CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    local_bc = *local_b8;
    fVar6 = *local_b0;
    if (fVar6 < local_bc) {
      if (local_bc <= local_94) {
        local_94 = local_94 - 6.2831855;
      }
      local_bc = local_bc - 6.2831855;
    }
    do {
      skipCenter_00 = (uint8_t)((uint)fVar7 >> 0x18);
      if (local_bc <= local_94 && local_94 <= fVar6) goto LAB_0010f36b;
      iVar3 = SDL_ReportAssertion(&ComputeEmitterChannelCoefficients::sdl_assert_data_1,
                                  "ComputeEmitterChannelCoefficients",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0x42e);
      skipCenter_00 = (uint8_t)((uint)fVar7 >> 0x18);
    } while (iVar3 == 0);
    if (iVar3 == 1) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
LAB_0010f36b:
    fVar6 = (local_94 - local_bc) / (fVar6 - local_bc);
    fVar7 = local_b0[1];
    uVar4 = (ulong)((int)local_b8[1] * local_48 + local_44);
    *(float *)(local_50 + uVar4 * 4) = (1.0 - fVar6) * fVar5 + *(float *)(local_50 + uVar4 * 4);
    uVar4 = (ulong)((int)fVar7 * local_48 + local_44);
    *(float *)(local_50 + uVar4 * 4) = fVar6 * fVar5 + *(float *)(local_50 + uVar4 * 4);
  }
  if (0.0 < local_88[2]) {
    fVar7 = local_88[2] * local_38;
    local_94 = (float)SDL_atan2f(local_30[5] * local_6c +
                                 local_30[3] * (float)local_74 + local_30[4] * local_74._4_4_,
                                 local_30[2] * local_6c +
                                 *local_30 * (float)local_74 + local_30[1] * local_74._4_4_);
    local_94 = local_94 + 3.1415927;
    if (0.0 <= local_94) {
      if (6.2831855 < local_94) {
        local_94 = local_94 - 6.2831855;
      }
    }
    else {
      local_94 = local_94 + 6.2831855;
    }
    FindSpeakerAzimuths((ConfigInfo *)CONCAT44(in_stack_ffffffffffffff04,fVar8),fVar10,skipCenter_00
                        ,(SpeakerInfo **)
                         CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    local_bc = *local_b8;
    fVar10 = *local_b0;
    if (fVar10 < local_bc) {
      if (local_bc <= local_94) {
        local_94 = local_94 - 6.2831855;
      }
      local_bc = local_bc - 6.2831855;
    }
    do {
      if (local_bc <= local_94 && local_94 <= fVar10) goto LAB_0010f6b0;
      iVar3 = SDL_ReportAssertion(&ComputeEmitterChannelCoefficients::sdl_assert_data_2,
                                  "ComputeEmitterChannelCoefficients",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0x464);
    } while (iVar3 == 0);
    if (iVar3 == 1) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
LAB_0010f6b0:
    fVar8 = (local_94 - local_bc) / (fVar10 - local_bc);
    fVar10 = local_b0[1];
    uVar4 = (ulong)((int)local_b8[1] * local_48 + local_44);
    *(float *)(local_50 + uVar4 * 4) = (1.0 - fVar8) * fVar7 + *(float *)(local_50 + uVar4 * 4);
    uVar4 = (ulong)((int)fVar10 * local_48 + local_44);
    *(float *)(local_50 + uVar4 * 4) = fVar8 * fVar7 + *(float *)(local_50 + uVar4 * 4);
  }
  if ((local_40 & 0x20000) != 0) {
    do {
      if (*(int *)(local_28 + 0x14) != -1) goto LAB_0010f7d5;
      iVar3 = SDL_ReportAssertion(&ComputeEmitterChannelCoefficients::sdl_assert_data_3,
                                  "ComputeEmitterChannelCoefficients",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0x471);
    } while (iVar3 == 0);
    if (iVar3 == 1) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
LAB_0010f7d5:
    uVar4 = (ulong)(*(int *)(local_28 + 0x14) * local_48 + local_44);
    *(float *)(local_50 + uVar4 * 4) = local_3c / (float)local_48 + *(float *)(local_50 + uVar4 * 4)
    ;
  }
  return;
}

Assistant:

static inline void ComputeEmitterChannelCoefficients(
	const ConfigInfo *curConfig,
	const F3DAUDIO_BASIS *listenerBasis,
	float innerRadius,
	F3DAUDIO_VECTOR channelPosition,
	float attenuation,
	float LFEattenuation,
	uint32_t flags,
	uint32_t currentChannel,
	uint32_t numSrcChannels,
	float *pMatrixCoefficients
) {
	float elevation, radialDistance;
	F3DAUDIO_VECTOR projTopVec, projPlane;
	uint8_t skipCenter = (flags & F3DAUDIO_CALCULATE_ZEROCENTER) ? 1 : 0;
	DiffusionSpeakerFactors diffusionFactors = { 0.0f };

	float x, y;
	float emitterAzimuth;
	float energyPerChannel;
	float totalEnergy;
	uint32_t nChannelsToDiffuseTo;
	uint32_t iS, centerChannelIdx = -1;
	const SpeakerInfo* infos[2];
	float a0, a1, val;
	uint32_t i0, i1;

	/* We project against the listener basis' top vector to get the elevation of the
	 * current emitter channel position.
	 */
	elevation = VectorDot(listenerBasis->top, channelPosition);

	/* To obtain the projection in the front-right plane of the listener's basis of the
	 * emitter channel position, we simply remove the projection against the top vector.
	 * The radial distance is then the length of the projected vector.
	 */
	projTopVec = VectorScale(listenerBasis->top, elevation);
	projPlane = VectorSub(channelPosition, projTopVec);
	radialDistance = VectorLength(projPlane);

	ComputeInnerRadiusDiffusionFactors(
		radialDistance,
		innerRadius,
		diffusionFactors
	);

	/* See the ComputeInnerRadiusDiffusionFactors comment above for more context. */
	/* DIFFUSION_SPEAKERS_ALL corresponds to diffusing part of the sound to all of the
	 * speakers, equally. The amount of sound is determined by the float value
	 * diffusionFactors[DIFFUSION_SPEAKERS_ALL]. */
	if (diffusionFactors[DIFFUSION_SPEAKERS_ALL] > 0.0f)
	{
		nChannelsToDiffuseTo = curConfig->numNonLFSpeakers;
		totalEnergy = diffusionFactors[DIFFUSION_SPEAKERS_ALL] * attenuation;

		if (skipCenter)
		{
			nChannelsToDiffuseTo -= 1;
			FAudio_assert(curConfig->speakers[0].azimuth == SPEAKER_AZIMUTH_CENTER);
			centerChannelIdx = curConfig->speakers[0].matrixIdx;
		}

		energyPerChannel = totalEnergy / nChannelsToDiffuseTo;

		for (iS = 0; iS < curConfig->numNonLFSpeakers; iS += 1)
		{
			const uint32_t curSpeakerIdx = curConfig->speakers[iS].matrixIdx;
			if (skipCenter && curSpeakerIdx == centerChannelIdx)
			{
				continue;
			}

			pMatrixCoefficients[curSpeakerIdx * numSrcChannels + currentChannel] += energyPerChannel;
		}
	}

	/* DIFFUSION_SPEAKERS_MATCHING corresponds to sending part of the sound to the speakers closest
	 * (in terms of azimuth) to the current position of the emitter. The amount of sound we shoud send
	 * corresponds here to diffusionFactors[DIFFUSION_SPEAKERS_MATCHING].
	 * We use the FindSpeakerAzimuths function to find the speakers that match. */
	if (diffusionFactors[DIFFUSION_SPEAKERS_MATCHING] > 0.0f)
	{
		const float totalEnergy = diffusionFactors[DIFFUSION_SPEAKERS_MATCHING] * attenuation;

		x = VectorDot(listenerBasis->front, projPlane);
		y = VectorDot(listenerBasis->right, projPlane);

		/* Now, a critical point: We shouldn't be sending sound to
		 * matching speakers when x and y are close to 0. That's the
		 * contract we get from ComputeInnerRadiusDiffusionFactors,
		 * which checks that we're not too close to the zero distance.
		 * This allows the atan2 calculation to give good results.
		 */

		/* atan2 returns [-PI, PI], but we want [0, 2PI] */
		emitterAzimuth = FAudio_atan2f(y, x);
		if (emitterAzimuth < 0.0f)
		{
			emitterAzimuth += F3DAUDIO_2PI;
		}

		FindSpeakerAzimuths(curConfig, emitterAzimuth, skipCenter, infos);
		a0 = infos[0]->azimuth;
		a1 = infos[1]->azimuth;

		/* The following code is necessary to handle the singularity in
		 * (0 == 2PI). It'll give us a nice, well ordered interval.
		 */
		if (a0 > a1)
		{
			if (emitterAzimuth >= a0)
			{
				emitterAzimuth -= F3DAUDIO_2PI;
			}
			a0 -= F3DAUDIO_2PI;
		}
		FAudio_assert(emitterAzimuth >= a0 && emitterAzimuth <= a1);

		val = (emitterAzimuth - a0) / (a1 - a0);

		i0 = infos[0]->matrixIdx;
		i1 = infos[1]->matrixIdx;

		pMatrixCoefficients[i0 * numSrcChannels + currentChannel] += (1.0f - val) * totalEnergy;
		pMatrixCoefficients[i1 * numSrcChannels + currentChannel] += (       val) * totalEnergy;
	}

	/* DIFFUSION_SPEAKERS_OPPOSITE corresponds to sending part of the sound to the speakers
	 * _opposite_ the ones that are the closest to the current emitter position.
	 * To find these, we simply find the ones that are closest to the current emitter's azimuth + PI
	 * using the FindSpeakerAzimuth function. */
	if (diffusionFactors[DIFFUSION_SPEAKERS_OPPOSITE] > 0.0f)
	{
		/* This code is similar to the matching speakers code above. */
		const float totalEnergy = diffusionFactors[DIFFUSION_SPEAKERS_OPPOSITE] * attenuation;

		x = VectorDot(listenerBasis->front, projPlane);
		y = VectorDot(listenerBasis->right, projPlane);

		/* Similarly, we expect atan2 to be well behaved here. */
		emitterAzimuth = FAudio_atan2f(y, x);

		/* Opposite speakers lie at azimuth + PI */
		emitterAzimuth += F3DAUDIO_PI;

		/* Normalize to [0; 2PI) range. */
		if (emitterAzimuth < 0.0f)
		{
			emitterAzimuth += F3DAUDIO_2PI;
		}
		else if (emitterAzimuth > F3DAUDIO_2PI)
		{
			emitterAzimuth -= F3DAUDIO_2PI;
		}

		FindSpeakerAzimuths(curConfig, emitterAzimuth, skipCenter, infos);
		a0 = infos[0]->azimuth;
		a1 = infos[1]->azimuth;

		/* The following code is necessary to handle the singularity in
		 * (0 == 2PI). It'll give us a nice, well ordered interval.
		 */
		if (a0 > a1)
		{
			if (emitterAzimuth >= a0)
			{
				emitterAzimuth -= F3DAUDIO_2PI;
			}
			a0 -= F3DAUDIO_2PI;
		}
		FAudio_assert(emitterAzimuth >= a0 && emitterAzimuth <= a1);

		val = (emitterAzimuth - a0) / (a1 - a0);

		i0 = infos[0]->matrixIdx;
		i1 = infos[1]->matrixIdx;

		pMatrixCoefficients[i0 * numSrcChannels + currentChannel] += (1.0f - val) * totalEnergy;
		pMatrixCoefficients[i1 * numSrcChannels + currentChannel] += (       val) * totalEnergy;
	}

	if (flags & F3DAUDIO_CALCULATE_REDIRECT_TO_LFE)
	{
		FAudio_assert(curConfig->LFSpeakerIdx != -1);
		pMatrixCoefficients[curConfig->LFSpeakerIdx * numSrcChannels + currentChannel] += LFEattenuation / numSrcChannels;
	}
}